

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O3

void __thiscall
embree::SceneGraph::AnimatedLightNode::AnimatedLightNode
          (AnimatedLightNode *this,
          vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
          *lights,BBox1f time_range)

{
  (this->super_LightNode).super_Node.super_RefCount.refCounter.super___atomic_base<unsigned_long>.
  _M_i = 0;
  (this->super_LightNode).super_Node.fileName._M_dataplus._M_p =
       (pointer)&(this->super_LightNode).super_Node.fileName.field_2;
  (this->super_LightNode).super_Node.fileName._M_string_length = 0;
  (this->super_LightNode).super_Node.fileName.field_2._M_local_buf[0] = '\0';
  (this->super_LightNode).super_Node.name._M_dataplus._M_p =
       (pointer)&(this->super_LightNode).super_Node.name.field_2;
  (this->super_LightNode).super_Node.name._M_string_length = 0;
  (this->super_LightNode).super_Node.name.field_2._M_local_buf[0] = '\0';
  (this->super_LightNode).super_Node.indegree = 0;
  (this->super_LightNode).super_Node.closed = false;
  (this->super_LightNode).super_Node.hasLightOrCamera = false;
  (this->super_LightNode).super_Node.id = 0xffffffff;
  (this->super_LightNode).super_Node.geometry = (void *)0x0;
  (this->super_LightNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__AnimatedLightNode_002c7c68;
  std::
  vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
  ::vector(&this->lights,lights);
  this->time_range = time_range;
  return;
}

Assistant:

AnimatedLightNode (const std::vector<Ref<LightNode>>&& lights, BBox1f time_range)
        : lights(lights), time_range(time_range) {}